

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_log10>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [24];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined4 uVar68;
  long *in_RDI;
  float fVar69;
  undefined1 auVar70 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_log10 op;
  Mat *m;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf y_1;
  v4sf z_1;
  v4sf tmp_1;
  v4sf mask_1;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_1;
  v4si emm0;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  int local_157c;
  undefined8 local_1578;
  undefined8 local_1570;
  undefined8 local_1568;
  undefined4 local_1560;
  long local_1558;
  undefined4 local_1550;
  undefined4 local_154c;
  undefined4 local_1548;
  undefined4 local_1544;
  undefined4 local_1540;
  undefined8 local_1538;
  undefined1 (*local_1530) [32];
  int local_1528;
  int local_1524;
  int local_1520;
  int local_151c;
  int local_1518;
  int local_1514;
  int local_1510;
  undefined1 local_1509 [9];
  long *local_1500;
  undefined1 local_14f5;
  int local_14f4;
  undefined8 *local_14e8;
  undefined8 *local_14e0;
  undefined8 *local_14d0;
  undefined1 (*local_14c8) [32];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined1 (*local_1490) [32];
  undefined1 (*local_1488) [32];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined1 (*local_1470) [32];
  long local_1468;
  undefined4 local_145c;
  long local_1458;
  undefined1 (*local_1450) [32];
  undefined4 local_1444;
  int local_1440;
  int local_143c;
  undefined8 *local_1438;
  undefined4 local_142c;
  long local_1428;
  undefined8 *local_1418;
  undefined8 *local_13f0;
  undefined1 *local_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [8];
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [8];
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  ulong uStack_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [8];
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [32];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [8];
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  ulong uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 *local_1008;
  float *local_1000;
  undefined1 *local_ff8;
  undefined1 *local_ff0;
  float *local_fe8;
  undefined1 *local_fe0;
  float *local_fd8;
  undefined1 *local_fd0;
  undefined1 *local_fc8;
  float *local_fc0;
  undefined1 *local_fb8;
  undefined1 *local_fb0;
  float *local_fa8;
  undefined1 *local_fa0;
  undefined1 *local_f98;
  float *local_f90;
  undefined1 *local_f88;
  undefined1 *local_f80;
  float *local_f78;
  undefined1 *local_f70;
  undefined1 *local_f68;
  float *local_f60;
  undefined1 *local_f58;
  undefined1 *local_f50;
  float *local_f48;
  undefined1 *local_f40;
  undefined1 *local_f38;
  float *local_f30;
  undefined1 *local_f28;
  undefined1 *local_f20;
  undefined1 *local_f18;
  float *local_f10;
  float *local_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  float local_e40 [2];
  float afStack_e38 [2];
  float afStack_e30 [2];
  float afStack_e28 [2];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0 [2];
  float afStack_dd8 [2];
  float afStack_dd0 [2];
  float afStack_dc8 [2];
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  float local_d80 [2];
  float afStack_d78 [2];
  float afStack_d70 [2];
  float afStack_d68 [2];
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20 [2];
  float afStack_d18 [2];
  float afStack_d10 [2];
  float afStack_d08 [2];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float local_cc0 [2];
  float afStack_cb8 [2];
  float afStack_cb0 [2];
  float afStack_ca8 [2];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60 [2];
  float afStack_c58 [2];
  float afStack_c50 [2];
  float afStack_c48 [2];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00 [2];
  float afStack_bf8 [2];
  float afStack_bf0 [2];
  float afStack_be8 [2];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0 [2];
  float afStack_b98 [2];
  float afStack_b90 [2];
  float afStack_b88 [2];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  ulong uStack_b28;
  float local_b20 [2];
  float afStack_b18 [2];
  float afStack_b10 [2];
  float afStack_b08 [2];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  float local_ac0 [2];
  float afStack_ab8 [2];
  float afStack_ab0 [2];
  float afStack_aa8 [2];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60 [2];
  float afStack_a58 [2];
  float afStack_a50 [2];
  float afStack_a48 [2];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined4 local_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined4 local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined4 local_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined4 local_704;
  undefined1 local_700 [32];
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined8 *local_6b0;
  undefined1 *local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  undefined8 uStack_678;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 local_630 [16];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined1 local_610 [16];
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined1 local_590 [16];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined1 *local_448;
  float *local_440;
  float *local_438;
  undefined1 *local_430;
  float *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  float *local_410;
  undefined1 *local_408;
  float *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  float *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  float *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  float *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  float *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  float *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  float *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  float *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330 [2];
  float afStack_328 [2];
  undefined8 local_320;
  undefined8 uStack_318;
  float local_310 [2];
  float afStack_308 [2];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2e0 [2];
  float afStack_2d8 [2];
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float local_2b0 [2];
  float afStack_2a8 [2];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  float local_280 [2];
  float afStack_278 [2];
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_250 [2];
  float afStack_248 [2];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  float local_220 [2];
  float afStack_218 [2];
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1f0 [2];
  float afStack_1e8 [2];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0 [2];
  float afStack_1b8 [2];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined4 local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  ulong uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_44;
  undefined1 (*local_40) [32];
  undefined1 *local_38;
  
  local_1510 = *(int *)((long)in_RDI + 0x2c);
  local_1514 = (int)in_RDI[6];
  local_1518 = *(int *)((long)in_RDI + 0x34);
  local_151c = (int)in_RDI[7];
  local_1520 = (int)in_RDI[3];
  local_1524 = local_1510 * local_1514 * local_1518 * local_1520;
  local_1500 = in_RDI;
  for (local_1528 = 0; local_1528 < local_151c; local_1528 = local_1528 + 1) {
    local_14e8 = &local_1578;
    local_143c = *(int *)((long)local_1500 + 0x2c);
    local_1440 = (int)local_1500[6];
    local_1444 = *(undefined4 *)((long)local_1500 + 0x34);
    local_1450 = (undefined1 (*) [32])
                 (*local_1500 + local_1500[8] * (long)local_1528 * local_1500[2]);
    local_1458 = local_1500[2];
    local_145c = (undefined4)local_1500[3];
    local_1468 = local_1500[4];
    local_1438 = &local_1578;
    local_1428 = (long)local_143c * (long)local_1440 * local_1458;
    local_14e0 = &local_1578;
    local_14d0 = &local_1578;
    local_142c = 0x10;
    local_14f4 = local_1528;
    local_14f5 = 1;
    local_1578 = 0;
    local_1568 = 0;
    local_1560 = 0;
    local_1550 = 0;
    local_154c = 0;
    local_1548 = 0;
    local_1544 = 0;
    local_1540 = 0;
    local_1538 = 0;
    local_1570 = 0;
    uVar6 = uStack_1588;
    local_1530 = local_1450;
    for (local_157c = 0; uStack_1588 = uVar6, uVar68 = uStack_1588._4_4_, fVar67 = uStack_1590._4_4_
        , fVar66 = uStack_1598._4_4_, fVar69 = local_15a0._4_4_, local_157c + 7 < local_1524;
        local_157c = local_157c + 8) {
      local_14c8 = local_1530;
      uStack_1028 = *(undefined8 *)(*local_1530 + 0x18);
      uStack_1598._4_4_ = (float)((ulong)*(undefined8 *)(*local_1530 + 8) >> 0x20);
      uStack_1590._0_4_ = (undefined4)*(undefined8 *)(*local_1530 + 0x10);
      uStack_1590._4_4_ = (float)((ulong)*(undefined8 *)(*local_1530 + 0x10) >> 0x20);
      uStack_1588._0_4_ = (undefined4)uStack_1028;
      uStack_1588._4_4_ = (undefined4)((ulong)uStack_1028 >> 0x20);
      local_13e8 = local_1509;
      local_13f0 = &local_15a0;
      auVar5._12_4_ = uStack_1598._4_4_;
      auVar5._0_12_ = *(undefined1 (*) [12])*local_1530;
      auVar58._16_4_ = (undefined4)uStack_1590;
      auVar58._0_16_ = auVar5;
      auVar58._20_4_ = uStack_1590._4_4_;
      auVar60._12_4_ = uStack_1598._4_4_;
      auVar60._0_12_ = *(undefined1 (*) [12])*local_1530;
      auVar60._16_4_ = (undefined4)uStack_1590;
      auVar60._20_4_ = uStack_1590._4_4_;
      auVar60._24_4_ = (undefined4)uStack_1588;
      auVar60._28_4_ = uStack_1588._4_4_;
      auVar59._12_4_ = uStack_1598._4_4_;
      auVar59._0_12_ = *(undefined1 (*) [12])*local_1530;
      auVar59._16_4_ = (undefined4)uStack_1590;
      auVar59._20_4_ = uStack_1590._4_4_;
      auVar59._24_4_ = (undefined4)uStack_1588;
      auVar59._28_4_ = uStack_1588._4_4_;
      local_12e0 = 0x3f8000003f800000;
      uStack_12d8 = 0x3f8000003f800000;
      uStack_12d0 = 0x3f8000003f800000;
      uStack_12c8 = 0x3f8000003f800000;
      local_1140 = 0;
      uStack_1138 = 0;
      uStack_1130 = 0;
      uStack_1128 = 0;
      local_1300 = vcmpps_avx(auVar59,ZEXT1632(ZEXT816(0)),2);
      local_12a0 = SUB128(*(undefined1 (*) [12])*local_1530,0);
      local_1040 = local_12a0;
      uStack_1298 = auVar5._8_8_;
      uStack_1038 = uStack_1298;
      uStack_1290 = auVar58._16_8_;
      uStack_1030 = uStack_1290;
      local_1060 = 0x80000000800000;
      uStack_1058 = 0x80000000800000;
      uStack_1050 = 0x80000000800000;
      uStack_1048 = 0x80000000800000;
      auVar23._8_8_ = 0x80000000800000;
      auVar23._0_8_ = 0x80000000800000;
      auVar23._16_8_ = 0x80000000800000;
      auVar23._24_8_ = 0x80000000800000;
      auVar2 = vmaxps_avx(auVar60,auVar23);
      local_12a0 = auVar2._0_8_;
      local_960 = local_12a0;
      uStack_1298 = auVar2._8_8_;
      uStack_958 = uStack_1298;
      uStack_1290 = auVar2._16_8_;
      uStack_950 = uStack_1290;
      uStack_1288 = auVar2._24_8_;
      uStack_948 = uStack_1288;
      local_980 = local_12a0;
      uStack_978 = uStack_1298;
      uStack_970 = uStack_1290;
      uStack_968 = uStack_1288;
      local_984 = 0x17;
      local_a00 = local_12a0;
      uStack_9f8 = uStack_1298;
      uStack_9f0 = uStack_1290;
      uStack_9e8 = uStack_1288;
      local_760 = local_12a0;
      uStack_758 = uStack_1298;
      local_764 = 0x17;
      local_9a0 = vpsrld_avx(auVar2._0_16_,ZEXT416(0x17));
      local_780 = uStack_1290;
      uStack_778 = uStack_1288;
      local_784 = 0x17;
      local_9b0 = vpsrld_avx(auVar2._16_16_,ZEXT416(0x17));
      local_a20 = local_9a0._0_8_;
      uStack_a18 = local_9a0._8_8_;
      uStack_a10 = local_9b0._0_8_;
      uStack_a08 = local_9b0._8_8_;
      local_9e0 = local_9a0._0_8_;
      uStack_9d8 = local_9a0._8_8_;
      uStack_9d0 = local_9b0._0_8_;
      uStack_9c8 = local_9b0._8_8_;
      local_11e0 = local_12a0;
      uStack_11d8 = uStack_1298;
      uStack_11d0 = uStack_1290;
      uStack_11c8 = uStack_1288;
      local_1200 = 0x807fffff807fffff;
      uStack_11f8 = 0x807fffff807fffff;
      uStack_11f0 = 0x807fffff807fffff;
      uStack_11e8 = 0x807fffff807fffff;
      auVar20._8_8_ = 0x807fffff807fffff;
      auVar20._0_8_ = 0x807fffff807fffff;
      auVar20._16_8_ = 0x807fffff807fffff;
      auVar20._24_8_ = 0x807fffff807fffff;
      auVar2 = vandps_avx(auVar2,auVar20);
      local_12a0 = auVar2._0_8_;
      local_8e0 = local_12a0;
      uStack_1298 = auVar2._8_8_;
      uStack_8d8 = uStack_1298;
      uStack_1290 = auVar2._16_8_;
      uStack_8d0 = uStack_1290;
      uStack_1288 = auVar2._24_8_;
      uStack_8c8 = uStack_1288;
      local_900 = 0x3f0000003f000000;
      uStack_8f8 = 0x3f0000003f000000;
      uStack_8f0 = 0x3f0000003f000000;
      uStack_8e8 = 0x3f0000003f000000;
      auVar35._8_8_ = 0x3f0000003f000000;
      auVar35._0_8_ = 0x3f0000003f000000;
      auVar35._16_8_ = 0x3f0000003f000000;
      auVar35._24_8_ = 0x3f0000003f000000;
      auVar3 = vorps_avx(auVar2,auVar35);
      local_7e0 = local_9a0._0_8_;
      uStack_7d8 = local_9a0._8_8_;
      uStack_7d0 = local_9b0._0_8_;
      uStack_7c8 = local_9b0._8_8_;
      local_800 = 0x7f0000007f;
      uStack_7f8 = 0x7f0000007f;
      uStack_7f0 = 0x7f0000007f;
      uStack_7e8 = 0x7f0000007f;
      local_880 = local_9a0._0_8_;
      uStack_878 = local_9a0._8_8_;
      uStack_870 = local_9b0._0_8_;
      uStack_868 = local_9b0._8_8_;
      local_8a0 = 0x7f0000007f;
      uStack_898 = 0x7f0000007f;
      uStack_890 = 0x7f0000007f;
      uStack_888 = 0x7f0000007f;
      local_830 = 0x7f0000007f;
      uStack_828 = 0x7f0000007f;
      local_840 = 0x7f0000007f;
      uStack_838 = 0x7f0000007f;
      local_720 = local_9a0._0_8_;
      uStack_718 = local_9a0._8_8_;
      local_730 = 0x7f0000007f;
      uStack_728 = 0x7f0000007f;
      auVar1._8_8_ = 0x7f0000007f;
      auVar1._0_8_ = 0x7f0000007f;
      local_810 = vpsubd_avx(local_9a0,auVar1);
      local_740 = local_9b0._0_8_;
      uStack_738 = local_9b0._8_8_;
      local_750 = 0x7f0000007f;
      uStack_748 = 0x7f0000007f;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      local_820 = vpsubd_avx(local_9b0,auVar4);
      local_8c0 = local_810._0_8_;
      uStack_8b8 = local_810._8_8_;
      uStack_8b0 = local_820._0_8_;
      uStack_8a8 = local_820._8_8_;
      local_860 = local_810._0_8_;
      uStack_858 = local_810._8_8_;
      uStack_850 = local_820._0_8_;
      uStack_848 = local_820._8_8_;
      local_12c0 = local_810._0_8_;
      uStack_12b8 = local_810._8_8_;
      uStack_12b0 = local_820._0_8_;
      uStack_12a8 = local_820._8_8_;
      local_7c0 = local_810._0_8_;
      uStack_7b8 = local_810._8_8_;
      uStack_7b0 = local_820._0_8_;
      uStack_7a8 = local_820._8_8_;
      auVar36._16_8_ = local_820._0_8_;
      auVar36._0_16_ = local_810;
      auVar36._24_8_ = local_820._8_8_;
      auVar2 = vcvtdq2ps_avx(auVar36);
      local_1320 = auVar2._0_8_;
      uVar7 = local_1320;
      uStack_1318 = auVar2._8_8_;
      uVar8 = uStack_1318;
      uStack_1310 = auVar2._16_8_;
      uVar9 = uStack_1310;
      uStack_1308 = auVar2._24_8_;
      uVar10 = uStack_1308;
      local_e80 = 0x3f8000003f800000;
      uStack_e78 = 0x3f8000003f800000;
      uStack_e70 = 0x3f8000003f800000;
      uStack_e68 = 0x3f8000003f800000;
      local_e60._0_4_ = auVar2._0_4_;
      local_e60._4_4_ = auVar2._4_4_;
      uStack_e58._0_4_ = auVar2._8_4_;
      uStack_e58._4_4_ = auVar2._12_4_;
      uStack_e50._0_4_ = auVar2._16_4_;
      uStack_e50._4_4_ = auVar2._20_4_;
      uStack_e48._0_4_ = auVar2._24_4_;
      uStack_e48._4_4_ = auVar2._28_4_;
      local_1320._4_4_ = local_e60._4_4_ + 1.0;
      local_1320._0_4_ = (float)local_e60 + 1.0;
      uStack_1318._0_4_ = (float)uStack_e58 + 1.0;
      uStack_1318._4_4_ = uStack_e58._4_4_ + 1.0;
      uStack_1310._0_4_ = (float)uStack_e50 + 1.0;
      uStack_1310._4_4_ = uStack_e50._4_4_ + 1.0;
      auVar58 = _local_1320;
      uStack_1308._0_4_ = (float)uStack_e48 + 1.0;
      uStack_1308._4_4_ = uStack_e48._4_4_ + 1.0;
      auVar20 = _local_1320;
      local_1340 = vcmpps_avx(auVar3,_DAT_01f8f660,1);
      local_12a0 = auVar3._0_8_;
      local_1220 = local_12a0;
      uStack_1298 = auVar3._8_8_;
      uStack_1218 = uStack_1298;
      uStack_1290 = auVar3._16_8_;
      uStack_1210 = uStack_1290;
      uStack_1288 = auVar3._24_8_;
      uStack_1208 = uStack_1288;
      local_1240 = local_1340._0_8_;
      uStack_1238 = local_1340._8_8_;
      uStack_1230 = local_1340._16_8_;
      uStack_1228 = local_1340._24_8_;
      local_1360 = vandps_avx(auVar3,local_1340);
      local_1160 = local_12a0;
      uStack_1158 = uStack_1298;
      uStack_1150 = uStack_1290;
      uStack_1148 = uStack_1288;
      local_1180 = 0x3f8000003f800000;
      uStack_1178 = 0x3f8000003f800000;
      uStack_1170 = 0x3f8000003f800000;
      uStack_1168 = 0x3f8000003f800000;
      auVar22._8_8_ = 0x3f8000003f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      auVar22._16_8_ = 0x3f8000003f800000;
      auVar22._24_8_ = 0x3f8000003f800000;
      auVar2 = vsubps_avx(auVar3,auVar22);
      local_11a0 = local_1320;
      uStack_1198 = uStack_1318;
      uStack_1310 = auVar58._16_8_;
      uStack_1190 = uStack_1310;
      uStack_1308 = auVar20._24_8_;
      uStack_1188 = uStack_1308;
      local_1260 = 0x3f8000003f800000;
      uStack_1258 = 0x3f8000003f800000;
      uStack_1250 = 0x3f8000003f800000;
      uStack_1248 = 0x3f8000003f800000;
      local_1280 = local_1340._0_8_;
      uStack_1278 = local_1340._8_8_;
      uStack_1270 = local_1340._16_8_;
      uStack_1268 = local_1340._24_8_;
      auVar3._8_8_ = 0x3f8000003f800000;
      auVar3._0_8_ = 0x3f8000003f800000;
      auVar3._16_8_ = 0x3f8000003f800000;
      auVar3._24_8_ = 0x3f8000003f800000;
      local_11c0 = vandps_avx(auVar3,local_1340);
      auVar21._16_8_ = uStack_1310;
      auVar21._0_16_ = _local_1320;
      auVar21._24_8_ = uStack_1308;
      _local_1320 = vsubps_avx(auVar21,local_11c0);
      local_12a0 = auVar2._0_8_;
      uVar11 = local_12a0;
      uStack_1298 = auVar2._8_8_;
      uVar12 = uStack_1298;
      uStack_1290 = auVar2._16_8_;
      uVar13 = uStack_1290;
      uStack_1288 = auVar2._24_8_;
      uVar14 = uStack_1288;
      local_ea0._0_4_ = auVar2._0_4_;
      local_ea0._4_4_ = auVar2._4_4_;
      uStack_e98._0_4_ = auVar2._8_4_;
      uStack_e98._4_4_ = auVar2._12_4_;
      uStack_e90._0_4_ = auVar2._16_4_;
      uStack_e90._4_4_ = auVar2._20_4_;
      uStack_e88._0_4_ = auVar2._24_4_;
      uStack_e88._4_4_ = auVar2._28_4_;
      local_ec0._0_4_ = local_1360._0_4_;
      local_ec0._4_4_ = local_1360._4_4_;
      uStack_eb8._0_4_ = local_1360._8_4_;
      uStack_eb8._4_4_ = local_1360._12_4_;
      uStack_eb0._0_4_ = local_1360._16_4_;
      uStack_eb0._4_4_ = local_1360._20_4_;
      uStack_ea8._0_4_ = local_1360._24_4_;
      uStack_ea8._4_4_ = local_1360._28_4_;
      local_12a0._0_4_ = (float)local_ea0 + (float)local_ec0;
      local_12a0._4_4_ = local_ea0._4_4_ + local_ec0._4_4_;
      uStack_e98._0_4_ = (float)uStack_e98 + (float)uStack_eb8;
      uStack_e98._4_4_ = uStack_e98._4_4_ + uStack_eb8._4_4_;
      uStack_e90._0_4_ = (float)uStack_e90 + (float)uStack_eb0;
      uStack_e90._4_4_ = uStack_e90._4_4_ + uStack_eb0._4_4_;
      uStack_e88._0_4_ = (float)uStack_e88 + (float)uStack_ea8;
      fStack_1364 = uStack_e88._4_4_ + uStack_ea8._4_4_;
      uStack_1298._0_4_ = (float)uStack_e98;
      uStack_1298._4_4_ = uStack_e98._4_4_;
      uStack_1290._0_4_ = (float)uStack_e90;
      uStack_1290._4_4_ = uStack_e90._4_4_;
      auVar58 = _local_12a0;
      uStack_1288._0_4_ = (float)uStack_e88;
      uStack_1288._4_4_ = fStack_1364;
      auVar2 = _local_12a0;
      local_10a0 = local_12a0;
      uStack_1098 = uStack_1298;
      uStack_1290 = auVar58._16_8_;
      uStack_1090 = uStack_1290;
      uStack_1288 = auVar2._24_8_;
      uStack_1088 = uStack_1288;
      local_1380 = (float)local_12a0._0_4_ * (float)local_12a0._0_4_;
      fStack_137c = (float)local_12a0._4_4_ * (float)local_12a0._4_4_;
      fStack_1378 = (float)uStack_e98 * (float)uStack_e98;
      fStack_1374 = uStack_e98._4_4_ * uStack_e98._4_4_;
      fStack_1370 = (float)uStack_e90 * (float)uStack_e90;
      fStack_136c = uStack_e90._4_4_ * uStack_e90._4_4_;
      fStack_1368 = (float)uStack_e88 * (float)uStack_e88;
      uStack_1398 = 0x3d9021bb3d9021bb;
      local_13a0 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_1390 = 0x3d9021bb3d9021bb;
      uStack_1388 = 0x3d9021bb3d9021bb;
      local_ff0 = local_13a0;
      local_1008 = local_12a0;
      local_f30 = ::_ps256_cephes_log_p1;
      local_e00 = 0x3d9021bb3d9021bb;
      uStack_df8 = 0x3d9021bb3d9021bb;
      uStack_df0 = 0x3d9021bb3d9021bb;
      uStack_de8 = 0x3d9021bb3d9021bb;
      local_e20 = local_12a0;
      uStack_e18 = uStack_1298;
      uStack_e10 = uStack_1290;
      uStack_e08 = uStack_1288;
      local_e40[0] = -0.1151461;
      local_e40[1] = -0.1151461;
      afStack_e38[0] = -0.1151461;
      afStack_e38[1] = -0.1151461;
      afStack_e30[0] = -0.1151461;
      afStack_e30[1] = -0.1151461;
      afStack_e28[0] = -0.1151461;
      afStack_e28[1] = -0.1151461;
      auVar24._8_4_ = -0.1151461;
      auVar24._12_4_ = -0.1151461;
      auVar24._0_4_ = -0.1151461;
      auVar24._4_4_ = -0.1151461;
      auVar24._16_4_ = -0.1151461;
      auVar24._20_4_ = -0.1151461;
      auVar24._24_4_ = -0.1151461;
      auVar24._28_4_ = -0.1151461;
      auVar4 = vfmadd213ps_fma(auVar2,_local_13a0,auVar24);
      local_f48 = ::_ps256_cephes_log_p2;
      local_13a0 = auVar4._0_8_;
      local_da0 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uStack_d98 = uStack_1398;
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_dc0 = local_12a0;
      uStack_db8 = uStack_1298;
      uStack_db0 = uStack_1290;
      uStack_da8 = uStack_1288;
      local_de0[0] = 0.116769984;
      local_de0[1] = 0.116769984;
      afStack_dd8[0] = 0.116769984;
      afStack_dd8[1] = 0.116769984;
      afStack_dd0[0] = 0.116769984;
      afStack_dd0[1] = 0.116769984;
      afStack_dc8[0] = 0.116769984;
      afStack_dc8[1] = 0.116769984;
      auVar25._8_4_ = 0.116769984;
      auVar25._12_4_ = 0.116769984;
      auVar25._0_4_ = 0.116769984;
      auVar25._4_4_ = 0.116769984;
      auVar25._16_4_ = 0.116769984;
      auVar25._20_4_ = 0.116769984;
      auVar25._24_4_ = 0.116769984;
      auVar25._28_4_ = 0.116769984;
      auVar4 = vfmadd213ps_fma(auVar2,ZEXT1632(auVar4),auVar25);
      local_f60 = ::_ps256_cephes_log_p3;
      local_13a0 = auVar4._0_8_;
      local_d40 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uStack_d38 = uStack_1398;
      uStack_d30 = 0;
      uStack_d28 = 0;
      local_d60 = local_12a0;
      uStack_d58 = uStack_1298;
      uStack_d50 = uStack_1290;
      uStack_d48 = uStack_1288;
      local_d80[0] = -0.12420141;
      local_d80[1] = -0.12420141;
      afStack_d78[0] = -0.12420141;
      afStack_d78[1] = -0.12420141;
      afStack_d70[0] = -0.12420141;
      afStack_d70[1] = -0.12420141;
      afStack_d68[0] = -0.12420141;
      afStack_d68[1] = -0.12420141;
      auVar26._8_4_ = -0.12420141;
      auVar26._12_4_ = -0.12420141;
      auVar26._0_4_ = -0.12420141;
      auVar26._4_4_ = -0.12420141;
      auVar26._16_4_ = -0.12420141;
      auVar26._20_4_ = -0.12420141;
      auVar26._24_4_ = -0.12420141;
      auVar26._28_4_ = -0.12420141;
      auVar4 = vfmadd213ps_fma(auVar2,ZEXT1632(auVar4),auVar26);
      local_f78 = ::_ps256_cephes_log_p4;
      local_13a0 = auVar4._0_8_;
      local_ce0 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uStack_cd8 = uStack_1398;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_d00 = local_12a0;
      uStack_cf8 = uStack_1298;
      uStack_cf0 = uStack_1290;
      uStack_ce8 = uStack_1288;
      local_d20[0] = 0.14249323;
      local_d20[1] = 0.14249323;
      afStack_d18[0] = 0.14249323;
      afStack_d18[1] = 0.14249323;
      afStack_d10[0] = 0.14249323;
      afStack_d10[1] = 0.14249323;
      afStack_d08[0] = 0.14249323;
      afStack_d08[1] = 0.14249323;
      auVar27._8_4_ = 0.14249323;
      auVar27._12_4_ = 0.14249323;
      auVar27._0_4_ = 0.14249323;
      auVar27._4_4_ = 0.14249323;
      auVar27._16_4_ = 0.14249323;
      auVar27._20_4_ = 0.14249323;
      auVar27._24_4_ = 0.14249323;
      auVar27._28_4_ = 0.14249323;
      auVar4 = vfmadd213ps_fma(auVar2,ZEXT1632(auVar4),auVar27);
      local_f90 = ::_ps256_cephes_log_p5;
      local_13a0 = auVar4._0_8_;
      local_c80 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uStack_c78 = uStack_1398;
      uStack_c70 = 0;
      uStack_c68 = 0;
      local_ca0 = local_12a0;
      uStack_c98 = uStack_1298;
      uStack_c90 = uStack_1290;
      uStack_c88 = uStack_1288;
      local_cc0[0] = -0.16668057;
      local_cc0[1] = -0.16668057;
      afStack_cb8[0] = -0.16668057;
      afStack_cb8[1] = -0.16668057;
      afStack_cb0[0] = -0.16668057;
      afStack_cb0[1] = -0.16668057;
      afStack_ca8[0] = -0.16668057;
      afStack_ca8[1] = -0.16668057;
      auVar28._8_4_ = -0.16668057;
      auVar28._12_4_ = -0.16668057;
      auVar28._0_4_ = -0.16668057;
      auVar28._4_4_ = -0.16668057;
      auVar28._16_4_ = -0.16668057;
      auVar28._20_4_ = -0.16668057;
      auVar28._24_4_ = -0.16668057;
      auVar28._28_4_ = -0.16668057;
      auVar4 = vfmadd213ps_fma(auVar2,ZEXT1632(auVar4),auVar28);
      local_fa8 = ::_ps256_cephes_log_p6;
      local_13a0 = auVar4._0_8_;
      local_c20 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uStack_c18 = uStack_1398;
      uStack_c10 = 0;
      uStack_c08 = 0;
      local_c40 = local_12a0;
      uStack_c38 = uStack_1298;
      uStack_c30 = uStack_1290;
      uStack_c28 = uStack_1288;
      local_c60[0] = 0.20000714;
      local_c60[1] = 0.20000714;
      afStack_c58[0] = 0.20000714;
      afStack_c58[1] = 0.20000714;
      afStack_c50[0] = 0.20000714;
      afStack_c50[1] = 0.20000714;
      afStack_c48[0] = 0.20000714;
      afStack_c48[1] = 0.20000714;
      auVar29._8_4_ = 0.20000714;
      auVar29._12_4_ = 0.20000714;
      auVar29._0_4_ = 0.20000714;
      auVar29._4_4_ = 0.20000714;
      auVar29._16_4_ = 0.20000714;
      auVar29._20_4_ = 0.20000714;
      auVar29._24_4_ = 0.20000714;
      auVar29._28_4_ = 0.20000714;
      auVar4 = vfmadd213ps_fma(auVar2,ZEXT1632(auVar4),auVar29);
      local_fc0 = ::_ps256_cephes_log_p7;
      local_13a0 = auVar4._0_8_;
      local_bc0 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uStack_bb8 = uStack_1398;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      local_be0 = local_12a0;
      uStack_bd8 = uStack_1298;
      uStack_bd0 = uStack_1290;
      uStack_bc8 = uStack_1288;
      local_c00[0] = -0.24999994;
      local_c00[1] = -0.24999994;
      afStack_bf8[0] = -0.24999994;
      afStack_bf8[1] = -0.24999994;
      afStack_bf0[0] = -0.24999994;
      afStack_bf0[1] = -0.24999994;
      afStack_be8[0] = -0.24999994;
      afStack_be8[1] = -0.24999994;
      auVar30._8_4_ = -0.24999994;
      auVar30._12_4_ = -0.24999994;
      auVar30._0_4_ = -0.24999994;
      auVar30._4_4_ = -0.24999994;
      auVar30._16_4_ = -0.24999994;
      auVar30._20_4_ = -0.24999994;
      auVar30._24_4_ = -0.24999994;
      auVar30._28_4_ = -0.24999994;
      auVar4 = vfmadd213ps_fma(auVar2,ZEXT1632(auVar4),auVar30);
      local_fd8 = ::_ps256_cephes_log_p8;
      local_13a0 = auVar4._0_8_;
      local_b60 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uStack_b58 = uStack_1398;
      uStack_b50 = 0;
      uStack_b48 = 0;
      local_b80 = local_12a0;
      uStack_b78 = uStack_1298;
      uStack_b70 = uStack_1290;
      uStack_b68 = uStack_1288;
      local_ba0[0] = 0.3333333;
      local_ba0[1] = 0.3333333;
      afStack_b98[0] = 0.3333333;
      afStack_b98[1] = 0.3333333;
      afStack_b90[0] = 0.3333333;
      afStack_b90[1] = 0.3333333;
      afStack_b88[0] = 0.3333333;
      afStack_b88[1] = 0.3333333;
      auVar31._8_4_ = 0.3333333;
      auVar31._12_4_ = 0.3333333;
      auVar31._0_4_ = 0.3333333;
      auVar31._4_4_ = 0.3333333;
      auVar31._16_4_ = 0.3333333;
      auVar31._20_4_ = 0.3333333;
      auVar31._24_4_ = 0.3333333;
      auVar31._28_4_ = 0.3333333;
      auVar4 = vfmadd213ps_fma(auVar2,ZEXT1632(auVar4),auVar31);
      local_13a0 = auVar4._0_8_;
      uVar15 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uVar16 = uStack_1398;
      uStack_10b0 = 0;
      uStack_10a8 = 0;
      local_10e0 = local_12a0;
      uStack_10d8 = uStack_1298;
      uStack_10d0 = uStack_1290;
      uStack_10c8 = uStack_1288;
      local_10c0._0_4_ = auVar4._0_4_;
      local_10c0._4_4_ = auVar4._4_4_;
      uStack_10b8._0_4_ = auVar4._8_4_;
      uStack_10b8._4_4_ = auVar4._12_4_;
      local_13a0._4_4_ = local_10c0._4_4_ * (float)local_12a0._4_4_;
      local_13a0._0_4_ = (float)local_10c0 * (float)local_12a0._0_4_;
      uStack_1398._0_4_ = (float)uStack_10b8 * (float)uStack_e98;
      uStack_1398._4_4_ = uStack_10b8._4_4_ * uStack_e98._4_4_;
      uStack_1390._0_4_ = (float)uStack_e90 * 0.0;
      uStack_1390._4_4_ = uStack_e90._4_4_ * 0.0;
      auVar58 = _local_13a0;
      local_1100 = local_13a0;
      uStack_10f8 = uStack_1398;
      uStack_1390 = auVar58._16_8_;
      uStack_10f0 = uStack_1390;
      uStack_1388 = (ulong)(uint)((float)uStack_e88 * 0.0);
      uStack_10e8 = uStack_1388;
      local_1120 = CONCAT44(fStack_137c,local_1380);
      uStack_1118 = CONCAT44(fStack_1374,fStack_1378);
      uStack_1110 = CONCAT44(fStack_136c,fStack_1370);
      uStack_1108 = CONCAT44(fStack_1364,fStack_1368);
      uStack_1388._0_4_ = (float)uStack_e88 * 0.0 * fStack_1368;
      local_13a0._4_4_ = local_10c0._4_4_ * (float)local_12a0._4_4_ * fStack_137c;
      local_13a0._0_4_ = (float)local_10c0 * (float)local_12a0._0_4_ * local_1380;
      uStack_1398._0_4_ = (float)uStack_10b8 * (float)uStack_e98 * fStack_1378;
      uStack_1398._4_4_ = uStack_10b8._4_4_ * uStack_e98._4_4_ * fStack_1374;
      uStack_1390._0_4_ = (float)uStack_e90 * 0.0 * fStack_1370;
      uStack_1390._4_4_ = uStack_e90._4_4_ * 0.0 * fStack_136c;
      auVar58 = _local_13a0;
      uStack_1388._4_4_ = 0;
      auVar2 = _local_13a0;
      local_ff8 = local_1320;
      local_fe8 = ::_ps256_cephes_log_q1;
      local_b00 = local_1320;
      uStack_af8 = uStack_1318;
      uStack_af0 = uStack_1310;
      uStack_ae8 = uStack_1308;
      local_b20[0] = -0.00021219444;
      local_b20[1] = -0.00021219444;
      afStack_b18[0] = -0.00021219444;
      afStack_b18[1] = -0.00021219444;
      afStack_b10[0] = -0.00021219444;
      afStack_b10[1] = -0.00021219444;
      afStack_b08[0] = -0.00021219444;
      afStack_b08[1] = -0.00021219444;
      local_b40 = local_13a0;
      uStack_b38 = uStack_1398;
      uStack_1390 = auVar58._16_8_;
      uStack_b30 = uStack_1390;
      uStack_1388 = (ulong)(uint)(float)uStack_1388;
      uStack_b28 = uStack_1388;
      auVar32._8_4_ = -0.00021219444;
      auVar32._12_4_ = -0.00021219444;
      auVar32._0_4_ = -0.00021219444;
      auVar32._4_4_ = -0.00021219444;
      auVar32._16_4_ = -0.00021219444;
      auVar32._20_4_ = -0.00021219444;
      auVar32._24_4_ = -0.00021219444;
      auVar32._28_4_ = -0.00021219444;
      auVar4 = vfmadd213ps_fma(auVar32,_local_1320,auVar2);
      local_f08 = &local_1380;
      local_f10 = ::_ps256_0p5;
      local_a40 = CONCAT44(fStack_137c,local_1380);
      uStack_a38 = CONCAT44(fStack_1374,fStack_1378);
      uStack_a30 = CONCAT44(fStack_136c,fStack_1370);
      uStack_a28 = CONCAT44(fStack_1364,fStack_1368);
      auVar61._4_4_ = fStack_137c;
      auVar61._0_4_ = local_1380;
      auVar61._8_4_ = fStack_1378;
      auVar61._12_4_ = fStack_1374;
      auVar61._16_4_ = fStack_1370;
      auVar61._20_4_ = fStack_136c;
      auVar61._24_4_ = fStack_1368;
      auVar61._28_4_ = fStack_1364;
      local_a60[0] = 0.5;
      local_a60[1] = 0.5;
      afStack_a58[0] = 0.5;
      afStack_a58[1] = 0.5;
      afStack_a50[0] = 0.5;
      afStack_a50[1] = 0.5;
      afStack_a48[0] = 0.5;
      afStack_a48[1] = 0.5;
      local_13a0 = auVar4._0_8_;
      local_a80 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uStack_a78 = uStack_1398;
      uStack_a70 = 0;
      uStack_a68 = 0;
      auVar34._8_4_ = 0.5;
      auVar34._12_4_ = 0.5;
      auVar34._0_4_ = 0.5;
      auVar34._4_4_ = 0.5;
      auVar34._16_4_ = 0.5;
      auVar34._20_4_ = 0.5;
      auVar34._24_4_ = 0.5;
      auVar34._28_4_ = 0.5;
      auVar4 = vfnmadd213ps_fma(auVar34,auVar61,ZEXT1632(auVar4));
      local_ee0 = local_12a0;
      uStack_ed8 = uStack_1298;
      uStack_ed0 = uStack_1290;
      uStack_ec8 = uStack_1288;
      local_13a0 = auVar4._0_8_;
      uVar17 = local_13a0;
      uStack_1398 = auVar4._8_8_;
      uVar18 = uStack_1398;
      uStack_ef0 = 0;
      uStack_ee8 = 0;
      local_f00._0_4_ = auVar4._0_4_;
      local_f00._4_4_ = auVar4._4_4_;
      uStack_ef8._0_4_ = auVar4._8_4_;
      uStack_ef8._4_4_ = auVar4._12_4_;
      local_12a0._4_4_ = (float)local_12a0._4_4_ + local_f00._4_4_;
      local_12a0._0_4_ = (float)local_12a0._0_4_ + (float)local_f00;
      uStack_1298._0_4_ = (float)uStack_e98 + (float)uStack_ef8;
      uStack_1298._4_4_ = uStack_e98._4_4_ + uStack_ef8._4_4_;
      uStack_1290._0_4_ = (float)uStack_e90 + 0.0;
      uStack_1290._4_4_ = uStack_e90._4_4_ + 0.0;
      auVar58 = _local_12a0;
      uStack_1288._0_4_ = (float)uStack_e88 + 0.0;
      uStack_1288._4_4_ = fStack_1364 + 0.0;
      auVar2 = _local_12a0;
      local_1000 = ::_ps256_cephes_log_q2;
      local_aa0 = local_1320;
      uStack_a98 = uStack_1318;
      uStack_a90 = uStack_1310;
      uStack_a88 = uStack_1308;
      local_ac0[0] = 0.6933594;
      local_ac0[1] = 0.6933594;
      afStack_ab8[0] = 0.6933594;
      afStack_ab8[1] = 0.6933594;
      afStack_ab0[0] = 0.6933594;
      afStack_ab0[1] = 0.6933594;
      afStack_aa8[0] = 0.6933594;
      afStack_aa8[1] = 0.6933594;
      local_ae0 = local_12a0;
      uStack_ad8 = uStack_1298;
      uStack_1290 = auVar58._16_8_;
      uStack_ad0 = uStack_1290;
      uStack_1288 = auVar2._24_8_;
      uStack_ac8 = uStack_1288;
      auVar33._8_4_ = 0.6933594;
      auVar33._12_4_ = 0.6933594;
      auVar33._0_4_ = 0.6933594;
      auVar33._4_4_ = 0.6933594;
      auVar33._16_4_ = 0.6933594;
      auVar33._20_4_ = 0.6933594;
      auVar33._24_4_ = 0.6933594;
      auVar33._28_4_ = 0.6933594;
      auVar5 = vfmadd213ps_fma(auVar33,_local_1320,auVar2);
      local_12a0 = auVar5._0_8_;
      local_920 = local_12a0;
      uStack_1298 = auVar5._8_8_;
      uStack_918 = uStack_1298;
      uStack_910 = 0;
      uStack_908 = 0;
      local_940 = local_1300._0_8_;
      uStack_938 = local_1300._8_8_;
      uStack_930 = local_1300._16_8_;
      uStack_928 = local_1300._24_8_;
      _local_13c0 = vorps_avx(ZEXT1632(auVar5),local_1300);
      local_704 = 0x3ede5bd9;
      local_6d0 = 0x3ede5bd9;
      auVar4 = vinsertps_avx(ZEXT416(0x3ede5bd9),ZEXT416(0x3ede5bd9),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3ede5bd9),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3ede5bd9),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3ede5bd9),ZEXT416(0x3ede5bd9),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3ede5bd9),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3ede5bd9),0x30);
      auVar70._16_16_ = auVar4;
      auVar70._0_16_ = auVar1;
      local_700._0_8_ = auVar1._0_8_;
      local_700._8_8_ = auVar1._8_8_;
      local_700._16_8_ = auVar4._0_8_;
      local_700._24_8_ = auVar4._8_8_;
      local_13e0._0_4_ = auVar1._0_4_;
      local_13e0._4_4_ = auVar1._4_4_;
      uStack_13d8._0_4_ = auVar1._8_4_;
      uStack_13d8._4_4_ = auVar1._12_4_;
      uStack_13d0._0_4_ = auVar4._0_4_;
      uStack_13d0._4_4_ = auVar4._4_4_;
      uStack_13c8._0_4_ = auVar4._8_4_;
      local_15a0._4_4_ = (float)local_13c0._4_4_ * local_13e0._4_4_;
      uStack_1598._4_4_ = fStack_13b4 * uStack_13d8._4_4_;
      uStack_1590._4_4_ = fStack_13ac * uStack_13d0._4_4_;
      local_15a0 = CONCAT44(local_15a0._4_4_,(float)local_13c0._0_4_ * (float)local_13e0);
      uStack_1598 = CONCAT44(uStack_1598._4_4_,fStack_13b8 * (float)uStack_13d8);
      uStack_1590 = CONCAT44(uStack_1590._4_4_,fStack_13b0 * (float)uStack_13d0);
      uStack_14a8 = CONCAT44(uStack_13a4,fStack_13a8 * (float)uStack_13c8);
      uStack_1588._4_4_ = uStack_13a4;
      local_1490 = local_1530;
      auVar2._8_8_ = uStack_1598;
      auVar2._0_8_ = local_15a0;
      auVar2._16_8_ = uStack_1590;
      auVar2._24_8_ = uStack_14a8;
      *local_1530 = auVar2;
      local_1530 = local_1530 + 1;
      uVar6 = uStack_14a8;
      local_14c0 = local_15a0;
      uStack_14b8 = uStack_1598;
      uStack_14b0 = uStack_1590;
      local_13e0 = local_700._0_8_;
      uStack_13d8 = local_700._8_8_;
      uStack_13d0 = local_700._16_8_;
      uStack_13c8 = local_700._24_8_;
      _local_13a0 = _local_13c0;
      _local_12a0 = ZEXT1632(auVar5);
      local_10c0 = uVar15;
      uStack_10b8 = uVar16;
      local_1080 = local_10a0;
      uStack_1078 = uStack_1098;
      uStack_1070 = uStack_1090;
      uStack_1068 = uStack_1088;
      local_fe0 = local_ff8;
      local_fd0 = local_1008;
      local_fc8 = local_ff0;
      local_fb8 = local_1008;
      local_fb0 = local_ff0;
      local_fa0 = local_1008;
      local_f98 = local_ff0;
      local_f88 = local_1008;
      local_f80 = local_ff0;
      local_f70 = local_1008;
      local_f68 = local_ff0;
      local_f58 = local_1008;
      local_f50 = local_ff0;
      local_f40 = local_1008;
      local_f38 = local_ff0;
      local_f28 = local_1008;
      local_f20 = local_ff0;
      local_f18 = local_ff0;
      local_f00 = uVar17;
      uStack_ef8 = uVar18;
      local_ec0 = local_1360._0_8_;
      uStack_eb8 = local_1360._8_8_;
      uStack_eb0 = local_1360._16_8_;
      uStack_ea8 = local_1360._24_8_;
      local_ea0 = uVar11;
      uStack_e98 = uVar12;
      uStack_e90 = uVar13;
      uStack_e88 = uVar14;
      local_e60 = uVar7;
      uStack_e58 = uVar8;
      uStack_e50 = uVar9;
      uStack_e48 = uVar10;
      local_700 = auVar70;
      local_6cc = local_6d0;
      local_6c8 = local_6d0;
      local_6c4 = local_6d0;
      local_6c0 = local_6d0;
      local_6bc = local_6d0;
      local_6b8 = local_6d0;
      local_6b4 = local_6d0;
    }
    for (; fVar65 = uStack_15a8._4_4_, fVar64 = local_15b0._4_4_, uVar6 = local_15b0,
        uVar7 = uStack_15a8, uVar8 = local_15a0, uVar9 = uStack_1598, uVar10 = uStack_1590,
        uVar11 = uStack_1588, local_1418 = local_14d0, local_15b0._4_4_ = fVar64,
        uStack_15a8._4_4_ = fVar65, local_1558 = local_1468, local_157c + 3 < local_1524;
        local_157c = local_157c + 4) {
      local_1488 = local_1530;
      local_4d0 = *(undefined8 *)*local_1530;
      uStack_4c8 = *(undefined8 *)(*local_1530 + 8);
      uStack_15a8._4_4_ = (float)((ulong)uStack_4c8 >> 0x20);
      local_6a8 = local_1509;
      local_6b0 = &local_15b0;
      auVar57._12_4_ = uStack_15a8._4_4_;
      auVar57._0_12_ = *(undefined1 (*) [12])*local_1530;
      auVar56._12_4_ = uStack_15a8._4_4_;
      auVar56._0_12_ = *(undefined1 (*) [12])*local_1530;
      local_620 = 0x3f8000003f800000;
      uStack_618 = 0x3f8000003f800000;
      local_f0 = 0;
      local_550._8_8_ = SUB168(ZEXT816(0),4);
      uStack_e8 = local_550._8_8_;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_550._8_8_;
      local_630 = vcmpps_avx(auVar57,auVar63 << 0x40,2);
      local_4e0 = 0x80000000800000;
      uStack_4d8 = 0x80000000800000;
      auVar41._8_8_ = 0x80000000800000;
      auVar41._0_8_ = 0x80000000800000;
      auVar4 = vmaxps_avx(auVar56,auVar41);
      local_600 = auVar4._0_8_;
      local_d0 = local_600;
      uStack_5f8 = auVar4._8_8_;
      uStack_c8 = uStack_5f8;
      local_120 = local_600;
      uStack_118 = uStack_5f8;
      local_124 = 0x17;
      auVar5 = vpsrld_avx(auVar4,ZEXT416(0x17));
      local_5a0 = local_600;
      uStack_598 = uStack_5f8;
      local_5b0 = 0x807fffff807fffff;
      uStack_5a8 = 0x807fffff807fffff;
      auVar38._8_8_ = 0x807fffff807fffff;
      auVar38._0_8_ = 0x807fffff807fffff;
      auVar4 = vpand_avx(auVar4,auVar38);
      local_600 = auVar4._0_8_;
      local_90 = local_600;
      uStack_5f8 = auVar4._8_8_;
      uStack_88 = uStack_5f8;
      local_a0 = 0x3f0000003f000000;
      uStack_98 = 0x3f0000003f000000;
      auVar54._8_8_ = 0x3f0000003f000000;
      auVar54._0_8_ = 0x3f0000003f000000;
      auVar1 = vpor_avx(auVar4,auVar54);
      local_610._0_8_ = auVar5._0_8_;
      local_100 = local_610._0_8_;
      local_610._8_8_ = auVar5._8_8_;
      uStack_f8 = local_610._8_8_;
      local_110 = 0x7f0000007f;
      uStack_108 = 0x7f0000007f;
      auVar53._8_8_ = 0x7f0000007f;
      auVar53._0_8_ = 0x7f0000007f;
      local_610 = vpsubd_avx(auVar5,auVar53);
      local_460 = local_610._0_8_;
      uStack_458 = local_610._8_8_;
      auVar4 = vcvtdq2ps_avx(local_610);
      local_640 = auVar4._0_8_;
      uVar6 = local_640;
      uStack_638 = auVar4._8_8_;
      uVar7 = uStack_638;
      local_480 = 0x3f8000003f800000;
      uStack_478 = 0x3f8000003f800000;
      local_470._0_4_ = auVar4._0_4_;
      local_470._4_4_ = auVar4._4_4_;
      uStack_468._0_4_ = auVar4._8_4_;
      uStack_468._4_4_ = auVar4._12_4_;
      local_640._4_4_ = local_470._4_4_ + 1.0;
      local_640._0_4_ = (float)local_470 + 1.0;
      uStack_638._0_4_ = (float)uStack_468 + 1.0;
      uStack_638._4_4_ = uStack_468._4_4_ + 1.0;
      local_600 = auVar1._0_8_;
      local_70 = local_600;
      uStack_5f8 = auVar1._8_8_;
      uStack_68 = uStack_5f8;
      local_80 = 0x3f3504f33f3504f3;
      uStack_78 = 0x3f3504f33f3504f3;
      auVar55._8_8_ = 0x3f3504f33f3504f3;
      auVar55._0_8_ = 0x3f3504f33f3504f3;
      local_650 = vcmpps_avx(auVar1,auVar55,1);
      local_5c0 = local_600;
      uStack_5b8 = uStack_5f8;
      local_5d0 = local_650._0_8_;
      uStack_5c8 = local_650._8_8_;
      local_660 = vpand_avx(auVar1,local_650);
      local_560 = local_600;
      uStack_558 = uStack_5f8;
      local_570 = 0x3f8000003f800000;
      uStack_568 = 0x3f8000003f800000;
      auVar40._8_8_ = 0x3f8000003f800000;
      auVar40._0_8_ = 0x3f8000003f800000;
      auVar4 = vsubps_avx(auVar1,auVar40);
      local_580 = local_640;
      uStack_578 = uStack_638;
      local_5e0 = 0x3f8000003f800000;
      uStack_5d8 = 0x3f8000003f800000;
      local_5f0 = local_650._0_8_;
      uStack_5e8 = local_650._8_8_;
      auVar37._8_8_ = 0x3f8000003f800000;
      auVar37._0_8_ = 0x3f8000003f800000;
      local_590 = vpand_avx(auVar37,local_650);
      auVar39._8_8_ = uStack_638;
      auVar39._0_8_ = local_640;
      _local_640 = vsubps_avx(auVar39,local_590);
      local_600 = auVar4._0_8_;
      uVar8 = local_600;
      uStack_5f8 = auVar4._8_8_;
      uVar9 = uStack_5f8;
      local_490._0_4_ = auVar4._0_4_;
      local_490._4_4_ = auVar4._4_4_;
      uStack_488._0_4_ = auVar4._8_4_;
      uStack_488._4_4_ = auVar4._12_4_;
      local_4a0._0_4_ = local_660._0_4_;
      local_4a0._4_4_ = local_660._4_4_;
      uStack_498._0_4_ = local_660._8_4_;
      uStack_498._4_4_ = local_660._12_4_;
      local_600._0_4_ = (float)local_490 + (float)local_4a0;
      local_600._4_4_ = local_490._4_4_ + local_4a0._4_4_;
      uStack_488._0_4_ = (float)uStack_488 + (float)uStack_498;
      uStack_488._4_4_ = uStack_488._4_4_ + uStack_498._4_4_;
      uStack_5f8._0_4_ = (float)uStack_488;
      uStack_5f8._4_4_ = uStack_488._4_4_;
      local_500 = local_600;
      uStack_4f8 = uStack_5f8;
      local_670 = (float)local_600._0_4_ * (float)local_600._0_4_;
      fStack_66c = (float)local_600._4_4_ * (float)local_600._4_4_;
      fStack_668 = (float)uStack_488 * (float)uStack_488;
      fStack_664 = uStack_488._4_4_ * uStack_488._4_4_;
      uStack_678 = 0x3d9021bb3d9021bb;
      local_680 = (undefined1  [8])0x3d9021bb3d9021bb;
      local_448 = local_680;
      local_430 = local_600;
      local_358 = ::_ps_cephes_log_p1;
      local_2f0 = 0x3d9021bb3d9021bb;
      uStack_2e8 = 0x3d9021bb3d9021bb;
      local_300 = local_600;
      uStack_2f8 = uStack_5f8;
      local_310[0] = -0.1151461;
      local_310[1] = -0.1151461;
      afStack_308[0] = -0.1151461;
      afStack_308[1] = -0.1151461;
      auVar43._8_4_ = -0.1151461;
      auVar43._12_4_ = -0.1151461;
      auVar43._0_4_ = -0.1151461;
      auVar43._4_4_ = -0.1151461;
      auVar4 = vfmadd213ps_fma(_local_600,_local_680,auVar43);
      local_370 = ::_ps_cephes_log_p2;
      local_680 = auVar4._0_8_;
      local_2c0 = local_680;
      uStack_678 = auVar4._8_8_;
      uStack_2b8 = uStack_678;
      local_2d0 = local_600;
      uStack_2c8 = uStack_5f8;
      local_2e0[0] = 0.116769984;
      local_2e0[1] = 0.116769984;
      afStack_2d8[0] = 0.116769984;
      afStack_2d8[1] = 0.116769984;
      auVar44._8_4_ = 0.116769984;
      auVar44._12_4_ = 0.116769984;
      auVar44._0_4_ = 0.116769984;
      auVar44._4_4_ = 0.116769984;
      auVar4 = vfmadd213ps_fma(_local_600,auVar4,auVar44);
      local_388 = ::_ps_cephes_log_p3;
      local_680 = auVar4._0_8_;
      local_290 = local_680;
      uStack_678 = auVar4._8_8_;
      uStack_288 = uStack_678;
      local_2a0 = local_600;
      uStack_298 = uStack_5f8;
      local_2b0[0] = -0.12420141;
      local_2b0[1] = -0.12420141;
      afStack_2a8[0] = -0.12420141;
      afStack_2a8[1] = -0.12420141;
      auVar45._8_4_ = -0.12420141;
      auVar45._12_4_ = -0.12420141;
      auVar45._0_4_ = -0.12420141;
      auVar45._4_4_ = -0.12420141;
      auVar4 = vfmadd213ps_fma(_local_600,auVar4,auVar45);
      local_3a0 = ::_ps_cephes_log_p4;
      local_680 = auVar4._0_8_;
      local_260 = local_680;
      uStack_678 = auVar4._8_8_;
      uStack_258 = uStack_678;
      local_270 = local_600;
      uStack_268 = uStack_5f8;
      local_280[0] = 0.14249323;
      local_280[1] = 0.14249323;
      afStack_278[0] = 0.14249323;
      afStack_278[1] = 0.14249323;
      auVar46._8_4_ = 0.14249323;
      auVar46._12_4_ = 0.14249323;
      auVar46._0_4_ = 0.14249323;
      auVar46._4_4_ = 0.14249323;
      auVar4 = vfmadd213ps_fma(_local_600,auVar4,auVar46);
      local_3b8 = ::_ps_cephes_log_p5;
      local_680 = auVar4._0_8_;
      local_230 = local_680;
      uStack_678 = auVar4._8_8_;
      uStack_228 = uStack_678;
      local_240 = local_600;
      uStack_238 = uStack_5f8;
      local_250[0] = -0.16668057;
      local_250[1] = -0.16668057;
      afStack_248[0] = -0.16668057;
      afStack_248[1] = -0.16668057;
      auVar47._8_4_ = -0.16668057;
      auVar47._12_4_ = -0.16668057;
      auVar47._0_4_ = -0.16668057;
      auVar47._4_4_ = -0.16668057;
      auVar4 = vfmadd213ps_fma(_local_600,auVar4,auVar47);
      local_3d0 = ::_ps_cephes_log_p6;
      local_680 = auVar4._0_8_;
      local_200 = local_680;
      uStack_678 = auVar4._8_8_;
      uStack_1f8 = uStack_678;
      local_210 = local_600;
      uStack_208 = uStack_5f8;
      local_220[0] = 0.20000714;
      local_220[1] = 0.20000714;
      afStack_218[0] = 0.20000714;
      afStack_218[1] = 0.20000714;
      auVar48._8_4_ = 0.20000714;
      auVar48._12_4_ = 0.20000714;
      auVar48._0_4_ = 0.20000714;
      auVar48._4_4_ = 0.20000714;
      auVar4 = vfmadd213ps_fma(_local_600,auVar4,auVar48);
      local_3e8 = ::_ps_cephes_log_p7;
      local_680 = auVar4._0_8_;
      local_1d0 = local_680;
      uStack_678 = auVar4._8_8_;
      uStack_1c8 = uStack_678;
      local_1e0 = local_600;
      uStack_1d8 = uStack_5f8;
      local_1f0[0] = -0.24999994;
      local_1f0[1] = -0.24999994;
      afStack_1e8[0] = -0.24999994;
      afStack_1e8[1] = -0.24999994;
      auVar49._8_4_ = -0.24999994;
      auVar49._12_4_ = -0.24999994;
      auVar49._0_4_ = -0.24999994;
      auVar49._4_4_ = -0.24999994;
      auVar4 = vfmadd213ps_fma(_local_600,auVar4,auVar49);
      local_400 = ::_ps_cephes_log_p8;
      local_680 = auVar4._0_8_;
      local_1a0 = local_680;
      uStack_678 = auVar4._8_8_;
      uStack_198 = uStack_678;
      local_1b0 = local_600;
      uStack_1a8 = uStack_5f8;
      local_1c0[0] = 0.3333333;
      local_1c0[1] = 0.3333333;
      afStack_1b8[0] = 0.3333333;
      afStack_1b8[1] = 0.3333333;
      auVar50._8_4_ = 0.3333333;
      auVar50._12_4_ = 0.3333333;
      auVar50._0_4_ = 0.3333333;
      auVar50._4_4_ = 0.3333333;
      auVar4 = vfmadd213ps_fma(_local_600,auVar4,auVar50);
      local_680 = auVar4._0_8_;
      uVar10 = local_680;
      uStack_678 = auVar4._8_8_;
      uVar11 = uStack_678;
      local_520 = local_600;
      uStack_518 = uStack_5f8;
      local_510._0_4_ = auVar4._0_4_;
      local_510._4_4_ = auVar4._4_4_;
      uStack_508._0_4_ = auVar4._8_4_;
      uStack_508._4_4_ = auVar4._12_4_;
      local_680._4_4_ = local_510._4_4_ * (float)local_600._4_4_;
      local_680._0_4_ = (float)local_510 * (float)local_600._0_4_;
      uStack_678._0_4_ = (float)uStack_508 * (float)uStack_488;
      uStack_678._4_4_ = uStack_508._4_4_ * uStack_488._4_4_;
      local_530 = local_680;
      uStack_528 = uStack_678;
      local_540 = CONCAT44(fStack_66c,local_670);
      uStack_538 = CONCAT44(fStack_664,fStack_668);
      local_680._4_4_ = local_510._4_4_ * (float)local_600._4_4_ * fStack_66c;
      local_680._0_4_ = (float)local_510 * (float)local_600._0_4_ * local_670;
      uStack_678._0_4_ = (float)uStack_508 * (float)uStack_488 * fStack_668;
      uStack_678._4_4_ = uStack_508._4_4_ * uStack_488._4_4_ * fStack_664;
      local_420 = local_640;
      local_410 = ::_ps_cephes_log_q1;
      local_170 = local_640;
      uStack_168 = uStack_638;
      local_180[0] = -0.00021219444;
      local_180[1] = -0.00021219444;
      afStack_178[0] = -0.00021219444;
      afStack_178[1] = -0.00021219444;
      local_190 = local_680;
      uStack_188 = uStack_678;
      auVar51._8_4_ = -0.00021219444;
      auVar51._12_4_ = -0.00021219444;
      auVar51._0_4_ = -0.00021219444;
      auVar51._4_4_ = -0.00021219444;
      auVar4 = vfmadd213ps_fma(auVar51,_local_640,_local_680);
      local_438 = &local_670;
      local_440 = ::_ps_0p5;
      local_320 = CONCAT44(fStack_66c,local_670);
      uStack_318 = CONCAT44(fStack_664,fStack_668);
      auVar62._4_4_ = fStack_66c;
      auVar62._0_4_ = local_670;
      auVar62._8_4_ = fStack_668;
      auVar62._12_4_ = fStack_664;
      local_330[0] = 0.5;
      local_330[1] = 0.5;
      afStack_328[0] = 0.5;
      afStack_328[1] = 0.5;
      local_680 = auVar4._0_8_;
      local_340 = local_680;
      uStack_678 = auVar4._8_8_;
      uStack_338 = uStack_678;
      auVar42._8_4_ = 0.5;
      auVar42._12_4_ = 0.5;
      auVar42._0_4_ = 0.5;
      auVar42._4_4_ = 0.5;
      _local_680 = vfnmadd213ps_fma(auVar42,auVar62,auVar4);
      local_4b0 = local_600;
      uStack_4a8 = uStack_5f8;
      local_4c0._0_4_ = local_680._0_4_;
      local_4c0._4_4_ = local_680._4_4_;
      uStack_4b8._0_4_ = local_680._8_4_;
      uStack_4b8._4_4_ = local_680._12_4_;
      local_600._4_4_ = (float)local_600._4_4_ + local_4c0._4_4_;
      local_600._0_4_ = (float)local_600._0_4_ + (float)local_4c0;
      uStack_5f8._0_4_ = (float)uStack_488 + (float)uStack_4b8;
      uStack_5f8._4_4_ = uStack_488._4_4_ + uStack_4b8._4_4_;
      local_428 = ::_ps_cephes_log_q2;
      local_140 = local_640;
      uStack_138 = uStack_638;
      local_150[0] = 0.6933594;
      local_150[1] = 0.6933594;
      afStack_148[0] = 0.6933594;
      afStack_148[1] = 0.6933594;
      local_160 = local_600;
      uStack_158 = uStack_5f8;
      auVar52._8_4_ = 0.6933594;
      auVar52._12_4_ = 0.6933594;
      auVar52._0_4_ = 0.6933594;
      auVar52._4_4_ = 0.6933594;
      auVar4 = vfmadd213ps_fma(auVar52,_local_640,_local_600);
      local_600 = auVar4._0_8_;
      local_b0 = local_600;
      uStack_5f8 = auVar4._8_8_;
      uStack_a8 = uStack_5f8;
      local_c0 = local_630._0_8_;
      uStack_b8 = local_630._8_8_;
      _local_690 = vpor_avx(auVar4,local_630);
      local_44 = 0x3ede5bd9;
      local_60 = 0x3ede5bd9;
      local_6a0 = 0x3ede5bd93ede5bd9;
      uStack_698 = 0x3ede5bd93ede5bd9;
      local_15b0._4_4_ = (float)local_690._4_4_ * 0.4342945;
      uStack_15a8._4_4_ = fStack_684 * 0.4342945;
      local_15b0 = CONCAT44(local_15b0._4_4_,(float)local_690._0_4_ * 0.4342945);
      uStack_15a8 = CONCAT44(uStack_15a8._4_4_,fStack_688 * 0.4342945);
      local_1470 = local_1530;
      auVar19._8_8_ = uStack_15a8;
      auVar19._0_8_ = local_15b0;
      *(undefined1 (*) [16])*local_1530 = auVar19;
      local_1530 = (undefined1 (*) [32])(*local_1530 + 0x10);
      local_1480 = local_15b0;
      uStack_1478 = uStack_15a8;
      _local_600 = _local_690;
      local_550 = ZEXT816(0) << 0x20;
      local_510 = uVar10;
      uStack_508 = uVar11;
      local_4f0 = local_500;
      uStack_4e8 = uStack_4f8;
      local_4c0 = local_680;
      uStack_4b8 = uStack_678;
      local_4a0 = local_660._0_8_;
      uStack_498 = local_660._8_8_;
      local_490 = uVar8;
      uStack_488 = uVar9;
      local_470 = uVar6;
      uStack_468 = uVar7;
      local_418 = local_448;
      local_408 = local_420;
      local_3f8 = local_430;
      local_3f0 = local_448;
      local_3e0 = local_430;
      local_3d8 = local_448;
      local_3c8 = local_430;
      local_3c0 = local_448;
      local_3b0 = local_430;
      local_3a8 = local_448;
      local_398 = local_430;
      local_390 = local_448;
      local_380 = local_430;
      local_378 = local_448;
      local_368 = local_430;
      local_360 = local_448;
      local_350 = local_430;
      local_348 = local_448;
      local_e0 = local_4d0;
      uStack_d8 = uStack_4c8;
      uStack_5c = local_60;
      uStack_58 = local_60;
      uStack_54 = local_60;
    }
    for (; uStack_1588._4_4_ = uVar68, uStack_1590._4_4_ = fVar67, uStack_1598._4_4_ = fVar66,
        local_15a0._4_4_ = fVar69, uStack_1588 = uVar11, uStack_1590 = uVar10, uStack_1598 = uVar9,
        local_15a0 = uVar8, uStack_15a8 = uVar7, local_15b0 = uVar6, uVar68 = uStack_1588._4_4_,
        fVar65 = uStack_1590._4_4_, fVar64 = uStack_1598._4_4_, fVar67 = local_15a0._4_4_,
        fVar66 = uStack_15a8._4_4_, fVar69 = local_15b0._4_4_, local_157c < local_1524;
        local_157c = local_157c + 1) {
      local_38 = local_1509;
      local_40 = local_1530;
      uVar6 = local_15b0;
      local_15b0._4_4_ = fVar69;
      uVar7 = uStack_15a8;
      uStack_15a8._4_4_ = fVar66;
      uVar8 = local_15a0;
      local_15a0._4_4_ = fVar67;
      uVar9 = uStack_1598;
      uStack_1598._4_4_ = fVar64;
      uVar10 = uStack_1590;
      uStack_1590._4_4_ = fVar65;
      uVar11 = uStack_1588;
      uStack_1588._4_4_ = uVar68;
      fVar69 = log10f(*(float *)*local_1530);
      uVar11 = uStack_1588;
      uVar10 = uStack_1590;
      uVar9 = uStack_1598;
      uVar8 = local_15a0;
      uVar7 = uStack_15a8;
      uVar6 = local_15b0;
      *(float *)*local_1530 = fVar69;
      local_1530 = (undefined1 (*) [32])(*local_1530 + 4);
      fVar69 = local_15a0._4_4_;
      fVar66 = uStack_1598._4_4_;
      fVar67 = uStack_1590._4_4_;
      uVar68 = uStack_1588._4_4_;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}